

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O0

bool S2::UpdateEndpoint(R1Interval *bound,int end,double value)

{
  double dVar1;
  double value_local;
  int end_local;
  R1Interval *bound_local;
  
  if (end == 0) {
    dVar1 = R1Interval::hi(bound);
    if (dVar1 < value) {
      return false;
    }
    dVar1 = R1Interval::lo(bound);
    if (dVar1 < value) {
      R1Interval::set_lo(bound,value);
    }
  }
  else {
    dVar1 = R1Interval::lo(bound);
    if (value < dVar1) {
      return false;
    }
    dVar1 = R1Interval::hi(bound);
    if (value < dVar1) {
      R1Interval::set_hi(bound,value);
    }
  }
  return true;
}

Assistant:

inline static bool UpdateEndpoint(R1Interval* bound, int end, double value) {
  if (end == 0) {
    if (bound->hi() < value) return false;
    if (bound->lo() < value) bound->set_lo(value);
  } else {
    if (bound->lo() > value) return false;
    if (bound->hi() > value) bound->set_hi(value);
  }
  return true;
}